

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O3

double psnr(jas_matrix_t *x,jas_matrix_t *y,int depth)

{
  double dVar1;
  
  dVar1 = msen(x,y,2);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = log10((double)~(-1 << ((byte)depth & 0x1f)) / dVar1);
    dVar1 = dVar1 * 20.0;
  }
  else {
    dVar1 = INFINITY;
  }
  return dVar1;
}

Assistant:

double psnr(jas_matrix_t *x, jas_matrix_t *y, int depth)
{
	double mse;
	double rmse;
	double p;
	mse = msen(x, y, 2);
	rmse = sqrt(mse);
	p = ((1 << depth) - 1);
	return (rmse != 0) ? (20.0 * log10(p / rmse)) : INFINITY;
}